

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifti_tool.c
# Opt level: O0

int disp_field_s_list(char *mesg,field_s *fp,int nfields)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  FILE *__stream;
  char *pcVar4;
  int local_20;
  int c;
  int nfields_local;
  field_s *fp_local;
  char *mesg_local;
  
  if (mesg != (char *)0x0) {
    fputs(mesg,_stdout);
  }
  fprintf(_stdout,
          " %d fields:\n   name                  size   len   offset   type\n   -------------------   ----   ---   ------   --------------\n"
          ,(ulong)(uint)nfields);
  _c = fp;
  for (local_20 = 0; __stream = _stdout, local_20 < nfields; local_20 = local_20 + 1) {
    uVar1 = _c->size;
    uVar2 = _c->len;
    iVar3 = _c->offset;
    pcVar4 = field_type_str(_c->type);
    fprintf(__stream,"   %-*s  %4d    %3d   %4d     %-14s\n",0x13,_c->name,(ulong)uVar1,(ulong)uVar2
            ,iVar3,pcVar4);
    _c = _c + 1;
  }
  return 0;
}

Assistant:

int disp_field_s_list( char * mesg, field_s * fp, int nfields )
{
   int c;

   if( mesg ) fputs(mesg, stdout);

   fprintf(stdout," %d fields:\n"
           "   name                  size   len   offset   type\n"
           "   -------------------   ----   ---   ------   --------------\n",
           nfields);

   for( c = 0; c < nfields; c++, fp++ )
      fprintf(stdout,"   %-*s  %4d    %3d   %4d     %-14s\n",
                     NT_FIELD_NAME_LEN-1, fp->name, fp->size, fp->len,
                     fp->offset, field_type_str(fp->type));

   return 0;
}